

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

void helics::processTimerCallback
               (shared_ptr<helics::MessageTimer> *mtimer,int32_t index,error_code *ec)

{
  bool bVar1;
  error_code *in_RDX;
  exception *e;
  int32_t in_stack_000000ac;
  MessageTimer *in_stack_000000b0;
  error_code *in_stack_ffffffffffffffc0;
  basic_errors in_stack_ffffffffffffffcc;
  error_code *in_stack_ffffffffffffffd0;
  
  std::error_code::error_code<asio::error::basic_errors,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  bVar1 = std::operator==(in_stack_ffffffffffffffc0,in_RDX);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6a9e3f);
    MessageTimer::sendMessage(in_stack_000000b0,in_stack_000000ac);
  }
  return;
}

Assistant:

static void processTimerCallback(const std::shared_ptr<MessageTimer>& mtimer,
                                 int32_t index,
                                 const std::error_code& ec)
{
    if (ec != asio::error::operation_aborted) {
        try {
            mtimer->sendMessage(index);
        }
        catch (std::exception& e) {
            std::cerr << "exception caught from sendMessage:" << e.what() << std::endl;
        }
    }
}